

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

void __thiscall spdlog::details::registry::set_error_handler(registry *this,err_handler *handler)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  int iVar3;
  _Any_data _Stack_48;
  code *local_38;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    for (p_Var1 = (this->loggers_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      p_Var2 = p_Var1[5]._M_nxt;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&_Stack_48,handler);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator=((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)(p_Var2 + 9),
                  (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&_Stack_48);
      if (local_38 != (code *)0x0) {
        (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
      }
    }
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&this->err_handler_,handler);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

SPDLOG_INLINE void registry::set_error_handler(err_handler handler)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    for (auto &l : loggers_)
    {
        l.second->set_error_handler(handler);
    }
    err_handler_ = std::move(handler);
}